

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxDebug.cpp
# Opt level: O2

void Diligent::LinuxDebug::AssertionFailed(Char *Message,char *Function,char *File,int Line)

{
  bool bVar1;
  int in_R9D;
  String AssertionFailedMessage;
  
  BasicPlatformDebug::FormatAssertionFailedMessage_abi_cxx11_
            (&AssertionFailedMessage,(BasicPlatformDebug *)Message,Function,File,
             (char *)(ulong)(uint)Line,in_R9D);
  if (DebugMessageCallback == (undefined *)0x0) {
    OutputDebugMessage(DEBUG_MESSAGE_SEVERITY_ERROR,AssertionFailedMessage._M_dataplus._M_p,
                       (char *)0x0,(char *)0x0,0,Auto);
  }
  else {
    (*(code *)DebugMessageCallback)(2,AssertionFailedMessage._M_dataplus._M_p,0,0,0);
  }
  bVar1 = BasicPlatformDebug::GetBreakOnError();
  if (bVar1) {
    raise(5);
  }
  std::__cxx11::string::~string((string *)&AssertionFailedMessage);
  return;
}

Assistant:

void LinuxDebug::AssertionFailed(const Char* Message, const char* Function, const char* File, int Line)
{
    String AssertionFailedMessage = FormatAssertionFailedMessage(Message, Function, File, Line);
    if (DebugMessageCallback)
    {
        DebugMessageCallback(DEBUG_MESSAGE_SEVERITY_ERROR, AssertionFailedMessage.c_str(), nullptr, nullptr, 0);
    }
    else
    {
        OutputDebugMessage(DEBUG_MESSAGE_SEVERITY_ERROR, AssertionFailedMessage.c_str(), nullptr, nullptr, 0);
    }

    if (GetBreakOnError())
    {
        raise(SIGTRAP);
    }
}